

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

locateresult __thiscall
tetgenmesh::slocate(tetgenmesh *this,point searchpt,face *searchsh,int aflag,int cflag,int rflag)

{
  int *piVar1;
  shellface ppdVar2;
  bool bVar3;
  locateresult lVar4;
  int *piVar5;
  shellface *pppdVar6;
  ulong uVar7;
  shellface ppdVar8;
  uint uVar9;
  tetgenmesh *this_00;
  int iVar10;
  shellface ppdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  undefined8 extraout_XMM0_Qb;
  double n [3];
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pppdVar6 = searchsh->sh;
  iVar10 = searchsh->shver;
  ppdVar11 = pppdVar6[sorgpivot[iVar10]];
  ppdVar8 = pppdVar6[sdestpivot[iVar10]];
  ppdVar2 = pppdVar6[sapexpivot[iVar10]];
  if (aflag == 0) {
    calculateabovepoint4(this,(point)ppdVar11,(point)ppdVar8,(point)ppdVar2,searchpt);
  }
  piVar1 = &searchsh->shver;
  dVar12 = orient3d((double *)ppdVar11,(double *)ppdVar8,(double *)ppdVar2,this->dummypoint);
  if (dVar12 <= 0.0) {
    if ((dVar12 == 0.0) && (!NAN(dVar12))) {
      return UNKNOWN;
    }
  }
  else {
    *(byte *)piVar1 = (byte)*piVar1 ^ 1;
  }
  iVar10 = 0;
  do {
    ppdVar11 = searchsh->sh[sorgpivot[searchsh->shver]];
    ppdVar8 = searchsh->sh[sdestpivot[searchsh->shver]];
    dVar12 = orient3d((double *)ppdVar11,(double *)ppdVar8,this->dummypoint,searchpt);
    if (0.0 < dVar12) goto LAB_0012d4bd;
    *piVar1 = snextpivot[*piVar1];
    iVar10 = iVar10 + 1;
  } while (iVar10 != 3);
  iVar10 = 3;
LAB_0012d4bd:
  if (iVar10 == 3) {
    return UNKNOWN;
  }
  this_00 = (tetgenmesh *)searchsh->sh[sapexpivot[searchsh->shver]];
  if (this_00 == (tetgenmesh *)searchpt) {
    iVar10 = snextpivot[snextpivot[searchsh->shver]];
  }
  else {
    do {
      dVar12 = orient3d((double *)ppdVar8,(double *)this_00,this->dummypoint,searchpt);
      dVar13 = orient3d((double *)this_00,(double *)ppdVar11,this->dummypoint,searchpt);
      if (0.0 <= dVar12) {
        if (dVar13 < 0.0) goto LAB_0012d5a1;
        if (dVar12 <= 0.0) {
          iVar10 = snextpivot[*piVar1];
          if (dVar13 <= 0.0) goto LAB_0012d659;
LAB_0012d6b7:
          *piVar1 = iVar10;
          lVar4 = ONEDGE;
          bVar3 = false;
        }
        else {
          if (dVar13 <= 0.0) {
            iVar10 = snextpivot[snextpivot[*piVar1]];
            goto LAB_0012d6b7;
          }
          lVar4 = ONFACE;
          bVar3 = true;
        }
        if (rflag == 0) {
          return lVar4;
        }
        pppdVar6 = searchsh->sh;
        iVar10 = searchsh->shver;
        ppdVar11 = pppdVar6[sorgpivot[iVar10]];
        ppdVar8 = pppdVar6[sdestpivot[iVar10]];
        ppdVar2 = pppdVar6[sapexpivot[iVar10]];
        facenormal(this_00,(point)ppdVar11,(point)ppdVar8,(point)ppdVar2,&local_78,1,(double *)0x0);
        dVar12 = local_68 * local_68 + local_78 * local_78 + local_70 * local_70;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        facenormal(this_00,(point)ppdVar8,(point)ppdVar2,searchpt,&local_78,1,(double *)0x0);
        uVar16 = 0;
        dVar13 = local_68 * local_68 + local_78 * local_78 + local_70 * local_70;
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
          uVar16 = extraout_XMM0_Qb;
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        local_48 = this->b->epsilon;
        uStack_40 = 0;
        facenormal(this_00,(point)ppdVar2,(point)ppdVar11,searchpt,&local_78,1,(double *)0x0);
        dVar14 = local_68 * local_68 + local_78 * local_78 + local_70 * local_70;
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
        dVar15 = 0.0;
        local_58 = dVar13 / dVar12;
        dVar14 = (double)(~-(ulong)(dVar14 / dVar12 < this->b->epsilon) & (ulong)dVar14);
        if (bVar3) {
          uStack_50 = uVar16;
          facenormal(this_00,(point)ppdVar11,(point)ppdVar8,searchpt,&local_78,1,(double *)0x0);
          dVar15 = local_68 * local_68 + local_78 * local_78 + local_70 * local_70;
          if (dVar15 < 0.0) {
            dVar15 = sqrt(dVar15);
          }
          else {
            dVar15 = SQRT(dVar15);
          }
          if (dVar15 / dVar12 < this->b->epsilon) {
            dVar15 = 0.0;
          }
        }
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          if (local_48 <= local_58 && dVar13 != 0.0) {
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              return ONFACE;
            }
            iVar10 = snextpivot[snextpivot[*piVar1]];
LAB_0012d99c:
            *piVar1 = iVar10;
            return ONEDGE;
          }
          iVar10 = snextpivot[*piVar1];
          if ((dVar14 != 0.0) || (NAN(dVar14))) goto LAB_0012d99c;
        }
        else {
          if (local_48 <= local_58 && dVar13 != 0.0) {
            return (dVar14 == 0.0) + ONEDGE;
          }
          iVar10 = *piVar1;
        }
        iVar10 = snextpivot[iVar10];
        goto LAB_0012d666;
      }
      piVar5 = piVar1;
      if ((dVar13 < 0.0) &&
         (uVar7 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar7,
         (uVar7 & 1) != 0)) {
LAB_0012d5a1:
        piVar5 = snextpivot + *piVar1;
      }
      *piVar1 = snextpivot[*piVar5];
      if ((cflag == 0) && (searchsh->sh[(long)(searchsh->shver >> 1) + 6] != (shellface)0x0)) {
        return ENCSEGMENT;
      }
      ppdVar11 = searchsh->sh[searchsh->shver >> 1];
      pppdVar6 = (shellface *)((ulong)ppdVar11 & 0xfffffffffffffff8);
      if (pppdVar6 == (shellface *)0x0) {
        return OUTSIDE;
      }
      uVar9 = (uint)ppdVar11 & 7;
      uVar9 = pppdVar6[sorgpivot[uVar9]] != searchsh->sh[sdestpivot[searchsh->shver]] ^ uVar9;
      searchsh->sh = pppdVar6;
      searchsh->shver = uVar9;
      uVar7 = (ulong)(uVar9 * 4);
      ppdVar11 = pppdVar6[*(int *)((long)sorgpivot + uVar7)];
      ppdVar8 = pppdVar6[*(int *)((long)sdestpivot + uVar7)];
      this_00 = (tetgenmesh *)pppdVar6[*(int *)((long)sapexpivot + uVar7)];
    } while (this_00 != (tetgenmesh *)searchpt);
    iVar10 = snextpivot[uVar9];
LAB_0012d659:
    iVar10 = snextpivot[iVar10];
  }
LAB_0012d666:
  *piVar1 = iVar10;
  return ONVERTEX;
}

Assistant:

enum tetgenmesh::locateresult tetgenmesh::slocate(point searchpt, 
  face* searchsh, int aflag, int cflag, int rflag)
{
  face neighsh;
  point pa, pb, pc;
  enum locateresult loc;
  enum {MOVE_BC, MOVE_CA} nextmove;
  REAL ori, ori_bc, ori_ca;
  int i;

  pa = sorg(*searchsh);
  pb = sdest(*searchsh);
  pc = sapex(*searchsh);

  if (!aflag) {
    // No above point is given. Calculate an above point for this facet.
    calculateabovepoint4(pa, pb, pc, searchpt);
  }

  // 'dummypoint' is given. Make sure it is above [a,b,c]
  ori = orient3d(pa, pb, pc, dummypoint);
  if (ori > 0) {
    sesymself(*searchsh); // Reverse the face orientation.
  } else if (ori == 0.0) {
    // This case should not happen theoretically. But... 
    return UNKNOWN; 
  }

  // Find an edge of the face s.t. p lies on its right-hand side (CCW).
  for (i = 0; i < 3; i++) {
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    ori = orient3d(pa, pb, dummypoint, searchpt);
    if (ori > 0) break;
    senextself(*searchsh);
  }
  if (i == 3) {
    return UNKNOWN;
  }

  pc = sapex(*searchsh);

  if (pc == searchpt) {
    senext2self(*searchsh);
    return ONVERTEX;
  }

  while (1) {

    ori_bc = orient3d(pb, pc, dummypoint, searchpt);
    ori_ca = orient3d(pc, pa, dummypoint, searchpt);

    if (ori_bc < 0) {
      if (ori_ca < 0) { // (--)
        // Any of the edges is a viable move.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_BC;
        }
      } else { // (-#)
        // Edge [b, c] is viable.
        nextmove = MOVE_BC;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        // Edge [c, a] is viable.
        nextmove = MOVE_CA;
      } else {
        if (ori_bc > 0) {
          if (ori_ca > 0) { // (++)
            loc = ONFACE;  // Inside [a, b, c].
            break;
          } else { // (+0)
            senext2self(*searchsh); // On edge [c, a].
            loc = ONEDGE;
            break;
          }
        } else { // ori_bc == 0
          if (ori_ca > 0) { // (0+)
            senextself(*searchsh); // On edge [b, c].
            loc = ONEDGE;
            break;
          } else { // (00)
            // p is coincident with vertex c. 
            senext2self(*searchsh);
            return ONVERTEX;
          }
        }
      }
    }

    // Move to the next face.
    if (nextmove == MOVE_BC) {
      senextself(*searchsh);
    } else {
      senext2self(*searchsh);
    }
    if (!cflag) {
      // NON-convex case. Check if we will cross a boundary.
      if (isshsubseg(*searchsh)) {
        return ENCSEGMENT;
      }
    }
    spivot(*searchsh, neighsh);
    if (neighsh.sh == NULL) {
      return OUTSIDE; // A hull edge.
    }
    // Adjust the edge orientation.
    if (sorg(neighsh) != sdest(*searchsh)) {
      sesymself(neighsh);
    }

    // Update the newly discovered face and its endpoints.
    *searchsh = neighsh;
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    if (pc == searchpt) {
      senext2self(*searchsh);
      return ONVERTEX;
    }

  } // while (1)

  // assert(loc == ONFACE || loc == ONEDGE);


  if (rflag) {
    // Round the locate result before return.
    REAL n[3], area_abc, area_abp, area_bcp, area_cap;

    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    facenormal(pa, pb, pc, n, 1, NULL);
    area_abc = sqrt(dot(n, n));

    facenormal(pb, pc, searchpt, n, 1, NULL);
    area_bcp = sqrt(dot(n, n));
    if ((area_bcp / area_abc) < b->epsilon) {
      area_bcp = 0; // Rounding.
    }

    facenormal(pc, pa, searchpt, n, 1, NULL);
    area_cap = sqrt(dot(n, n));
    if ((area_cap / area_abc) < b->epsilon) {
      area_cap = 0; // Rounding
    }

    if ((loc == ONFACE) || (loc == OUTSIDE)) {
      facenormal(pa, pb, searchpt, n, 1, NULL);
      area_abp = sqrt(dot(n, n));
      if ((area_abp / area_abc) < b->epsilon) {
        area_abp = 0; // Rounding
      }
    } else { // loc == ONEDGE
      area_abp = 0;
    }

    if (area_abp == 0) {
      if (area_bcp == 0) {
        senextself(*searchsh); 
        loc = ONVERTEX; // p is close to b.
      } else {
        if (area_cap == 0) {
          loc = ONVERTEX; // p is close to a.
        } else {
          loc = ONEDGE; // p is on edge [a,b].
        }
      }
    } else if (area_bcp == 0) {
      if (area_cap == 0) {
        senext2self(*searchsh); 
        loc = ONVERTEX; // p is close to c.
      } else {
        senextself(*searchsh);
        loc = ONEDGE; // p is on edge [b,c].
      }
    } else if (area_cap == 0) {
      senext2self(*searchsh);
      loc = ONEDGE; // p is on edge [c,a].
    } else {
      loc = ONFACE; // p is on face [a,b,c].
    }
  } // if (rflag)

  return loc;
}